

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

result * __thiscall
lest::expression_lhs<std::optional<int>const&>::operator==
          (result *__return_storage_ptr__,expression_lhs<std::optional<int>const&> *this,int *rhs)

{
  lest lVar1;
  int iVar2;
  int iVar3;
  lest *this_00;
  int *in_R8;
  allocator<char> local_71;
  optional<int> local_70 [4];
  string local_50;
  
  this_00 = *(lest **)this;
  lVar1 = this_00[4];
  iVar2 = *(int *)this_00;
  iVar3 = *rhs;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_70,"==",&local_71);
  to_string<std::optional<int>,int>(&local_50,this_00,local_70,(string *)rhs,in_R8);
  __return_storage_ptr__->passed = (bool)((byte)lVar1 & iVar2 == iVar3);
  std::__cxx11::string::string((string *)&__return_storage_ptr__->decomposition,(string *)&local_50)
  ;
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)local_70);
  return __return_storage_ptr__;
}

Assistant:

result operator<=( R const & rhs ) { return result( lhs <= rhs, to_string( lhs, "<=", rhs ) ); }